

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::int_writer<long_long,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::hex_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::int_writer<long_long,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::hex_writer>
             *this,char8_t **it)

{
  int iVar1;
  long lVar2;
  long lVar3;
  size_t __n;
  bool bVar4;
  char *digits;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  char8_t *pcVar8;
  char8_t *pcVar9;
  
  lVar2 = *(long *)(this + 0x10);
  pcVar9 = *it;
  if (lVar2 != 0) {
    lVar3 = *(long *)(this + 8);
    lVar6 = 0;
    do {
      pcVar9[lVar6] = *(char8_t *)(lVar3 + lVar6);
      lVar6 = lVar6 + 1;
    } while (lVar2 != lVar6);
    pcVar9 = pcVar9 + lVar6;
  }
  __n = *(size_t *)(this + 0x20);
  pcVar8 = pcVar9;
  if (__n != 0) {
    pcVar8 = pcVar9 + __n;
    memset(pcVar9,*(int *)(this + 0x18),__n);
  }
  *it = pcVar8;
  iVar1 = *(int *)(this + 0x30);
  pcVar5 = "0123456789ABCDEF";
  if (*(char *)(*(long *)(*(long *)(this + 0x28) + 8) + 0x11) == 'x') {
    pcVar5 = "0123456789abcdef";
  }
  pcVar9 = pcVar9 + __n + (long)iVar1;
  uVar7 = *(ulong *)(*(long *)(this + 0x28) + 0x10);
  do {
    pcVar9 = pcVar9 + -1;
    *pcVar9 = pcVar5[(uint)uVar7 & 0xf];
    bVar4 = 0xf < uVar7;
    uVar7 = uVar7 >> 4;
  } while (bVar4);
  *it = pcVar8 + iVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }